

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_top(Parser *this)

{
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  csubstr rem_00;
  bool bVar1;
  int iVar2;
  long in_RDI;
  size_t unaff_retaddr;
  Parser *in_stack_00000018;
  size_t in_stack_00000028;
  Parser *in_stack_00000030;
  csubstr trimmed;
  csubstr rem;
  Parser *in_stack_000000a8;
  undefined1 in_stack_000000b0 [16];
  Parser *in_stack_00000198;
  Parser *in_stack_00000410;
  csubstr in_stack_00000418;
  basic_substring<char_const> local_b0 [16];
  basic_substring<char_const> local_a0 [8];
  basic_substring<const_char> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  basic_substring<char_const> local_80 [16];
  basic_substring<char_const> local_70 [23];
  char c;
  basic_substring<const_char> *in_stack_ffffffffffffffa8;
  char *local_50;
  size_t sz;
  undefined1 in_stack_ffffffffffffffc0 [16];
  basic_substring<const_char> local_30 [2];
  char *in_stack_fffffffffffffff0;
  char **in_stack_fffffffffffffff8;
  
  c = (char)((ulong)stack0xffffffffffffffa0 >> 0x38);
  local_30[0].str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
  local_30[0].len = *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x80);
  bVar1 = basic_substring<const_char>::begins_with(local_30,'#');
  if (bVar1) {
    _scan_comment(in_stack_00000018);
  }
  else {
    _local_50 = basic_substring<const_char>::triml(in_stack_ffffffffffffffa8,c);
    bVar1 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)&local_50,'%');
    if (bVar1) {
      stack0xffffffffffffffa0 = local_50;
      _handle_directive(in_stack_000000a8,(csubstr)in_stack_000000b0);
      _line_progressed(in_stack_00000030,in_stack_00000028);
    }
    else {
      basic_substring<char_const>::basic_substring<5ul>(local_70,(char (*) [5])"--- ");
      pattern.len = in_stack_ffffffffffffff78;
      pattern.str = in_stack_ffffffffffffff70;
      bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff68,pattern);
      if (!bVar1) {
        in_stack_fffffffffffffff8 = &local_50;
        in_stack_fffffffffffffff0 = "---";
        iVar2 = basic_substring<const_char>::compare
                          (in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_,sz);
        if (iVar2 != 0) {
          basic_substring<char_const>::basic_substring<5ul>(local_80,(char (*) [5])"---\t");
          pattern_00.len = in_stack_ffffffffffffff78;
          pattern_00.str = in_stack_ffffffffffffff70;
          bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff68,pattern_00);
          if (!bVar1) {
            basic_substring<char_const>::basic_substring<4ul>(local_a0,(char (*) [4])0x3f3a31);
            pattern_01.len = in_stack_ffffffffffffff78;
            pattern_01.str = in_stack_ffffffffffffff70;
            bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff68,pattern_01);
            if (bVar1) {
              _end_stream(in_stack_00000198);
              if (sz < local_30[0].len) {
                _line_progressed(in_stack_00000030,in_stack_00000028);
              }
              _line_progressed(in_stack_00000030,in_stack_00000028);
              return true;
            }
            bVar1 = is_debugger_attached();
            if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            basic_substring<char_const>::basic_substring<19ul>
                      (local_b0,(char (*) [19])"ERROR: parse error");
            _err<>(in_stack_00000410,in_stack_00000418);
            return false;
          }
        }
      }
      rem_00.len = unaff_retaddr;
      rem_00.str = (char *)in_stack_fffffffffffffff8;
      _start_new_doc((Parser *)in_stack_fffffffffffffff0,rem_00);
      if (sz < local_30[0].len) {
        _line_progressed(in_stack_00000030,in_stack_00000028);
        _save_indentation((Parser *)rem.len,(size_t)rem.str);
      }
    }
  }
  return true;
}

Assistant:

bool Parser::_handle_top()
{
    _c4dbgp("handle_top");
    csubstr rem = m_state->line_contents.rem;

    if(rem.begins_with('#'))
    {
        _c4dbgp("a comment line");
        _scan_comment();
        return true;
    }

    csubstr trimmed = rem.triml(' ');

    if(trimmed.begins_with('%'))
    {
        _handle_directive(trimmed);
        _line_progressed(rem.len);
        return true;
    }
    else if(trimmed.begins_with("--- ") || trimmed == "---" || trimmed.begins_with("---\t"))
    {
        _start_new_doc(rem);
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
            _save_indentation();
        }
        return true;
    }
    else if(trimmed.begins_with("..."))
    {
        _c4dbgp("end current document");
        _end_stream();
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
        }
        _line_progressed(3);
        return true;
    }
    else
    {
        _c4err("parse error");
    }

    return false;
}